

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O1

bool tvm::runtime::RuntimeEnabled(string *target)

{
  int iVar1;
  PackedFunc *pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar3;
  bool bVar4;
  string f_name;
  string local_230;
  long *local_210 [2];
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  _Any_data local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  iVar1 = std::__cxx11::string::compare((char *)target);
  if (iVar1 == 0) {
    bVar4 = true;
    goto LAB_0010bf6f;
  }
  iVar1 = std::__cxx11::string::compare((char *)target);
  pcVar3 = "device_api.gpu";
  if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)target), iVar1 == 0)) {
LAB_0010bf45:
    std::__cxx11::string::_M_replace
              ((ulong)&local_230,0,(char *)local_230._M_string_length,(ulong)pcVar3);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)target);
    pcVar3 = "device_api.opencl";
    if ((iVar1 == 0) ||
       ((iVar1 = std::__cxx11::string::compare((char *)target), iVar1 == 0 ||
        (iVar1 = std::__cxx11::string::compare((char *)target), iVar1 == 0)))) goto LAB_0010bf45;
    iVar1 = std::__cxx11::string::compare((char *)target);
    pcVar3 = "device_api.opengl";
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)target), iVar1 == 0)) {
LAB_0010c053:
      std::__cxx11::string::operator=((string *)&local_230,pcVar3);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)target);
      pcVar3 = "device_api.metal";
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)target), iVar1 == 0))
      goto LAB_0010c053;
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) {
        pcVar3 = "device_api.vulkan";
        goto LAB_0010c053;
      }
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) {
        pcVar3 = "codegen.build_stackvm";
        goto LAB_0010c053;
      }
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) {
        pcVar3 = "device_api.rpc";
        goto LAB_0010c053;
      }
      iVar1 = std::__cxx11::string::compare((char *)target);
      pcVar3 = "device_api.vpi";
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)target), iVar1 == 0))
      goto LAB_0010c053;
      if (target->_M_string_length < 5) {
        bVar4 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_1d0,(ulong)target);
        iVar1 = std::__cxx11::string::compare((char *)local_1d0);
        bVar4 = iVar1 == 0;
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
      }
      if (bVar4) {
        pcVar3 = "device_api.gpu";
        goto LAB_0010c053;
      }
      if (target->_M_string_length < 4) {
        bVar4 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_1f0,(ulong)target);
        iVar1 = std::__cxx11::string::compare((char *)local_1f0);
        bVar4 = iVar1 == 0;
        if (local_1f0[0] != local_1e0) {
          operator_delete(local_1f0[0],local_1e0[0] + 1);
        }
      }
      if (bVar4) {
        pcVar3 = "device_api.rocm";
        goto LAB_0010c053;
      }
      if (target->_M_string_length < 4) {
        bVar4 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_210,(ulong)target);
        iVar1 = std::__cxx11::string::compare((char *)local_210);
        bVar4 = iVar1 == 0;
        if (local_210[0] != local_200) {
          operator_delete(local_210[0],local_200[0] + 1);
        }
      }
      if (bVar4) {
        local_1b0._M_unused._M_object = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"codegen.llvm_target_enabled","");
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Registry::Get((string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_unused._0_8_ != local_1a0) {
          operator_delete(local_1b0._M_unused._M_object,local_1a0[0]._M_allocated_capacity + 1);
        }
        if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = false;
        }
        else {
          PackedFunc::operator()((PackedFunc *)&local_1b0,args);
          bVar4 = TVMPODValue_::operator_cast_to_bool((TVMPODValue_ *)&local_1b0);
          TVMRetValue::Clear((TVMRetValue *)&local_1b0);
        }
        goto LAB_0010bf6f;
      }
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
                 ,0x9b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0._M_pod_data,"Unknown optional runtime ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0._M_pod_data,(target->_M_dataplus)._M_p,
                 target->_M_string_length);
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
  }
  pPVar2 = Registry::Get(&local_230);
  bVar4 = pPVar2 != (PackedFunc *)0x0;
LAB_0010bf6f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool RuntimeEnabled(const std::string &target) {
  std::string f_name;
  if (target == "cpu") {
    return true;
  } else if (target == "cuda" || target == "gpu") {
    f_name = "device_api.gpu";
  } else if (target == "cl" || target == "opencl" || target == "sdaccel") {
    f_name = "device_api.opencl";
  } else if (target == "gl" || target == "opengl") {
    f_name = "device_api.opengl";
  } else if (target == "mtl" || target == "metal") {
    f_name = "device_api.metal";
  } else if (target == "vulkan") {
    f_name = "device_api.vulkan";
  } else if (target == "stackvm") {
    f_name = "codegen.build_stackvm";
  } else if (target == "rpc") {
    f_name = "device_api.rpc";
  } else if (target == "vpi" || target == "verilog") {
    f_name = "device_api.vpi";
  } else if (target.length() >= 5 && target.substr(0, 5) == "nvptx") {
    f_name = "device_api.gpu";
  } else if (target.length() >= 4 && target.substr(0, 4) == "rocm") {
    f_name = "device_api.rocm";
  } else if (target.length() >= 4 && target.substr(0, 4) == "llvm") {
    const PackedFunc *pf = runtime::Registry::Get("codegen.llvm_target_enabled");
    if (pf == nullptr)
      return false;
    return (*pf)(target);
  } else {
    LOG(FATAL) << "Unknown optional runtime " << target;
  }
  return runtime::Registry::Get(f_name) != nullptr;
}